

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O0

int __thiscall HuffTree::get_full_code_size(HuffTree *this)

{
  bool bVar1;
  reference this_00;
  TreeNode *node;
  int d;
  deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
  q;
  int res;
  int padding;
  HuffTree *in_stack_ffffffffffffff20;
  TreeNode **in_stack_ffffffffffffff28;
  pair<const_HuffTree::TreeNode_*,_int> *__in;
  deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
  *in_stack_ffffffffffffff30;
  deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
  *in_stack_ffffffffffffff70;
  pair<const_HuffTree::TreeNode_*,_int> local_6c [5];
  int local_18;
  int local_14;
  int local_4;
  
  local_14 = 2;
  local_18 = 0;
  back_to_root(in_stack_ffffffffffffff20);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                     0x123805);
  if (bVar1) {
    std::
    deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
    ::deque((deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
             *)0x12382b);
    local_6c[0].first._0_4_ = 0;
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               in_stack_ffffffffffffff20);
    std::
    deque<std::pair<HuffTree::TreeNode_const*,int>,std::allocator<std::pair<HuffTree::TreeNode_const*,int>>>
    ::emplace_back<HuffTree::TreeNode_const*&,int&>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20)
    ;
    while (bVar1 = std::
                   deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
                   ::empty((deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
                            *)0x12386b), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = std::
                deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
                ::front(in_stack_ffffffffffffff30);
      __in = local_6c;
      std::tie<HuffTree::TreeNode_const*,int>(&__in->first,(int *)this_00);
      std::tuple<HuffTree::TreeNode_const*&,int&>::operator=
                ((tuple<const_HuffTree::TreeNode_*&,_int_&> *)in_stack_ffffffffffffff30,__in);
      in_stack_ffffffffffffff30 =
           (deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
            *)std::max<int>((int *)__in,&local_18);
      local_18 = *(int *)&(in_stack_ffffffffffffff30->
                          super__Deque_base<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
                          )._M_impl.super__Deque_impl_data._M_map;
      std::
      deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
      ::pop_front((deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
                   *)this_00);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *
                         )0x1238f5);
      if (bVar1) {
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   this_00);
        std::
        deque<std::pair<HuffTree::TreeNode_const*,int>,std::allocator<std::pair<HuffTree::TreeNode_const*,int>>>
        ::emplace_back<HuffTree::TreeNode*,int>
                  (in_stack_ffffffffffffff30,&__in->first,(int *)this_00);
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *
                         )0x123961);
      if (bVar1) {
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   this_00);
        std::
        deque<std::pair<HuffTree::TreeNode_const*,int>,std::allocator<std::pair<HuffTree::TreeNode_const*,int>>>
        ::emplace_back<HuffTree::TreeNode*,int>
                  (in_stack_ffffffffffffff30,&__in->first,(int *)this_00);
      }
    }
    local_4 = local_18 + local_14;
    std::
    deque<std::pair<const_HuffTree::TreeNode_*,_int>,_std::allocator<std::pair<const_HuffTree::TreeNode_*,_int>_>_>
    ::~deque(in_stack_ffffffffffffff70);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int HuffTree::get_full_code_size() {
    int padding = 2, res = 0;
    back_to_root();
    if (!root) {
        return 1;
    }
    std::deque<std::pair<const TreeNode *, int>> q;
    int d = 0;
    const TreeNode *node = root.get();
    q.emplace_back(node, d);
    while (!q.empty()) {
        std::tie(node, d) = q.front();
        res = std::max(d, res);
        q.pop_front();
        if (node->_left) {
            q.emplace_back(node->_left.get(), d + 1);
        }
        if (node->_right) {
            q.emplace_back(node->_right.get(), d + 1);
        }
    }
    return res + padding;
}